

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResult.cpp
# Opt level: O0

bool __thiscall
CppUnit::TestResult::protect(TestResult *this,Functor *functor,Test *test,string *shortDescription)

{
  int iVar1;
  undefined1 local_58 [8];
  ProtectorContext context;
  string *shortDescription_local;
  Test *test_local;
  Functor *functor_local;
  TestResult *this_local;
  
  context.m_shortDescription.field_2._8_8_ = shortDescription;
  ProtectorContext::ProtectorContext((ProtectorContext *)local_58,test,this,shortDescription);
  iVar1 = (*(this->m_protectorChain->super_Protector)._vptr_Protector[2])
                    (this->m_protectorChain,functor,(ProtectorContext *)local_58);
  ProtectorContext::~ProtectorContext((ProtectorContext *)local_58);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool 
TestResult::protect( const Functor &functor,
                     Test *test,
                     const std::string &shortDescription )
{
  ProtectorContext context( test, this, shortDescription );
  return m_protectorChain->protect( functor, context );
}